

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O2

void __thiscall XmlOutput::closeOpen(XmlOutput *this)

{
  if (Tag < this->currentState) {
    QTextStream::operator<<(this->xmlFile,'>');
    this->currentState = Tag;
  }
  return;
}

Assistant:

void XmlOutput::closeOpen()
{
    switch(currentState) {
        case Bare:
        case Tag:
            return;
        case Attribute:
            break;
    }
    xmlFile << '>';
    currentState = Tag;
}